

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vehicle.cpp
# Opt level: O1

bool __thiscall Vehicle::is_point_on_vehicle(Vehicle *this,Point *p)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  list<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_> *plVar4;
  _List_node_base *p_Var5;
  
  plVar4 = &this->nodes;
  p_Var5 = (_List_node_base *)plVar4;
  do {
    p_Var5 = (((_List_base<std::shared_ptr<VehicleState>,_std::allocator<std::shared_ptr<VehicleState>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar4) break;
    puVar3 = &(p_Var5[1]._M_next)->_M_next;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[1]._M_prev;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar1 = *(int *)*puVar3;
    iVar2 = p->id;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while (iVar1 != iVar2);
  return p_Var5 != (_List_node_base *)plVar4;
}

Assistant:

bool Vehicle::is_point_on_vehicle(Point *p) {
    for (auto value_: nodes) {
        if (value_->p->id == p->id) {
            return true;
        }
    }
    return false;
}